

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O3

string * __thiscall
tcu::FloatFormat::intervalToHex_abi_cxx11_
          (string *__return_storage_ptr__,FloatFormat *this,Interval *interval)

{
  double dVar1;
  double dVar2;
  bool bVar3;
  long lVar4;
  undefined8 *puVar5;
  long *plVar6;
  size_type *psVar7;
  char *pcVar8;
  char *pcVar9;
  ulong uVar10;
  undefined8 uVar11;
  ulong *puVar12;
  long *local_110;
  undefined8 local_108;
  long local_100;
  undefined8 uStack_f8;
  string local_f0;
  ulong *local_d0;
  long local_c8;
  ulong local_c0;
  long lStack_b8;
  ulong *local_b0;
  long local_a8;
  ulong local_a0;
  long lStack_98;
  string local_90;
  string local_70;
  ulong *local_50 [2];
  ulong local_40 [2];
  
  dVar1 = interval->m_lo;
  dVar2 = interval->m_hi;
  if (dVar2 < dVar1) {
    bVar3 = interval->m_hasNaN;
    pcVar9 = "{}";
    if ((ulong)bVar3 != 0) {
      pcVar9 = "{ NaN }";
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar8 = pcVar9 + (ulong)bVar3 * 5 + 2;
LAB_00a7bb35:
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar9,pcVar8);
    return __return_storage_ptr__;
  }
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    bVar3 = interval->m_hasNaN;
    if ((INFINITY <= dVar2) && ((dVar1 <= -INFINITY && (bVar3 != false)))) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar9 = "<any>";
      pcVar8 = "";
      goto LAB_00a7bb35;
    }
    pcVar9 = "";
    if (bVar3 != false) {
      pcVar9 = "{ NaN } | ";
    }
    pcVar8 = pcVar9 + 10;
    if (bVar3 == false) {
      pcVar8 = pcVar9;
    }
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar9,pcVar8);
    plVar6 = (long *)std::__cxx11::string::append((char *)local_50);
    puVar12 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar12) {
      local_a0 = *puVar12;
      lStack_98 = plVar6[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *puVar12;
      local_b0 = (ulong *)*plVar6;
    }
    local_a8 = plVar6[1];
    *plVar6 = (long)puVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    floatToHex_abi_cxx11_(&local_70,this,interval->m_lo);
    uVar10 = 0xf;
    if (local_b0 != &local_a0) {
      uVar10 = local_a0;
    }
    if (uVar10 < local_70._M_string_length + local_a8) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        uVar11 = local_70.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_70._M_string_length + local_a8) goto LAB_00a7be28;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,(ulong)local_b0);
    }
    else {
LAB_00a7be28:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_b0,(ulong)local_70._M_dataplus._M_p);
    }
    local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    puVar12 = puVar5 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar12) {
      local_f0.field_2._M_allocated_capacity = *puVar12;
      local_f0.field_2._8_8_ = puVar5[3];
    }
    else {
      local_f0.field_2._M_allocated_capacity = *puVar12;
      local_f0._M_dataplus._M_p = (pointer)*puVar5;
    }
    local_f0._M_string_length = puVar5[1];
    *puVar5 = puVar12;
    puVar5[1] = 0;
    *(undefined1 *)puVar12 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_f0);
    puVar12 = (ulong *)(plVar6 + 2);
    if ((ulong *)*plVar6 == puVar12) {
      local_c0 = *puVar12;
      lStack_b8 = plVar6[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *puVar12;
      local_d0 = (ulong *)*plVar6;
    }
    local_c8 = plVar6[1];
    *plVar6 = (long)puVar12;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    floatToHex_abi_cxx11_(&local_90,this,interval->m_hi);
    uVar10 = 0xf;
    if (local_d0 != &local_c0) {
      uVar10 = local_c0;
    }
    if (uVar10 < local_90._M_string_length + local_c8) {
      uVar11 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_dataplus._M_p != &local_90.field_2) {
        uVar11 = local_90.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar11 < local_90._M_string_length + local_c8) goto LAB_00a7bf4e;
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,(ulong)local_d0);
    }
    else {
LAB_00a7bf4e:
      puVar5 = (undefined8 *)
               std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_90._M_dataplus._M_p);
    }
    local_110 = &local_100;
    plVar6 = puVar5 + 2;
    if ((long *)*puVar5 == plVar6) {
      local_100 = *plVar6;
      uStack_f8 = puVar5[3];
    }
    else {
      local_100 = *plVar6;
      local_110 = (long *)*puVar5;
    }
    local_108 = puVar5[1];
    *puVar5 = plVar6;
    puVar5[1] = 0;
    *(undefined1 *)plVar6 = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar7) {
      lVar4 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if (local_110 != &local_100) {
      operator_delete(local_110,local_100 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0,local_c0 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    puVar12 = local_50[0];
    if (local_50[0] == local_40) {
      return __return_storage_ptr__;
    }
    goto LAB_00a7c0c1;
  }
  pcVar9 = "{ ";
  if ((ulong)interval->m_hasNaN != 0) {
    pcVar9 = "{ NaN, ";
  }
  local_d0 = &local_c0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d0,pcVar9,pcVar9 + (ulong)interval->m_hasNaN * 5 + 2);
  floatToHex_abi_cxx11_(&local_f0,this,interval->m_lo);
  uVar10 = 0xf;
  if (local_d0 != &local_c0) {
    uVar10 = local_c0;
  }
  if (uVar10 < local_f0._M_string_length + local_c8) {
    uVar11 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      uVar11 = local_f0.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar11 < local_f0._M_string_length + local_c8) goto LAB_00a7bbe6;
    puVar5 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_f0,0,(char *)0x0,(ulong)local_d0);
  }
  else {
LAB_00a7bbe6:
    puVar5 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_d0,(ulong)local_f0._M_dataplus._M_p);
  }
  local_110 = &local_100;
  plVar6 = puVar5 + 2;
  if ((long *)*puVar5 == plVar6) {
    local_100 = *plVar6;
    uStack_f8 = puVar5[3];
  }
  else {
    local_100 = *plVar6;
    local_110 = (long *)*puVar5;
  }
  local_108 = puVar5[1];
  *puVar5 = plVar6;
  puVar5[1] = 0;
  *(undefined1 *)plVar6 = 0;
  plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar7 = (size_type *)(plVar6 + 2);
  if ((size_type *)*plVar6 == psVar7) {
    lVar4 = plVar6[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar4;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar7;
  }
  __return_storage_ptr__->_M_string_length = plVar6[1];
  *plVar6 = (long)psVar7;
  plVar6[1] = 0;
  *(undefined1 *)(plVar6 + 2) = 0;
  if (local_110 != &local_100) {
    operator_delete(local_110,local_100 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  local_40[0] = local_c0;
  puVar12 = local_d0;
  if (local_d0 == &local_c0) {
    return __return_storage_ptr__;
  }
LAB_00a7c0c1:
  operator_delete(puVar12,local_40[0] + 1);
  return __return_storage_ptr__;
}

Assistant:

std::string FloatFormat::intervalToHex (const Interval& interval) const
{
	if (interval.empty())
		return interval.hasNaN() ? "{ NaN }" : "{}";

	else if (interval.lo() == interval.hi())
		return (std::string(interval.hasNaN() ? "{ NaN, " : "{ ") +
				floatToHex(interval.lo()) + " }");
	else if (interval == Interval::unbounded(true))
		return "<any>";

	return (std::string(interval.hasNaN() ? "{ NaN } | " : "") +
			"[" + floatToHex(interval.lo()) + ", " + floatToHex(interval.hi()) + "]");
}